

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O1

void filter(qnode_ptr_t p,qnode_ptr_t q,float trsh)

{
  disp_vect_t *pdVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  undefined4 in_XMM0_Db;
  
  iVar2 = p->sizy;
  if (0 < iVar2) {
    uVar3 = p->sizx;
    iVar4 = 0;
    do {
      if (0 < (int)uVar3) {
        piVar5 = &(*q->param_ptr[q->sizz / 2])[(long)q->res * (long)iVar4].err;
        uVar6 = 0;
        do {
          if (((float)piVar5[-1] <= (float)(double)CONCAT44(in_XMM0_Db,trsh)) || (*piVar5 != 0)) {
            pdVar1 = *p->flow_ptr + (long)p->res * (long)iVar4 + uVar6;
            pdVar1->x = -100.0;
            pdVar1->y = 100.0;
          }
          uVar6 = uVar6 + 1;
          piVar5 = piVar5 + 8;
        } while (uVar3 != uVar6);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != iVar2);
  }
  return;
}

Assistant:

void filter(p,q,trsh)
qnode_ptr_t p, q ;
float trsh ;

{ param_t P ;
  disp_vect_t Uerr ;
  int i, j ;

  Uerr.x = -100.0 ;
  Uerr.y = 100.0 ;

  for (i = 0 ; i < p->sizy ; i++) {
    for (j = 0 ; j < p->sizx ; j++) {
      P = (*q->param_ptr[q->sizz/2])[q->res*i + j] ;
      if (P.mag <= trsh || P.err != NO_ERROR) {
        (*p->flow_ptr)[p->res*i + j] = Uerr ;
      }
    }
  }
}